

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O1

void __thiscall
gmath::PinholeCamera::projectPointLocal(PinholeCamera *this,Vector2d *p,Vector3d *Pc)

{
  double dVar1;
  Distortion *pDVar2;
  int i;
  long lVar3;
  Vector3d P;
  double local_28 [3];
  
  dVar1 = Pc->v[2];
  local_28[0] = 0.0;
  local_28[1] = 0.0;
  local_28[2] = 0.0;
  lVar3 = 0;
  do {
    local_28[lVar3] = Pc->v[lVar3] / dVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  pDVar2 = this->dist;
  if (pDVar2 != (Distortion *)0x0) {
    (*pDVar2->_vptr_Distortion[6])(local_28[0],local_28[1],pDVar2,local_28);
  }
  *(double *)p = (this->A).v[0][0] * local_28[0] + (this->A).v[0][1] * local_28[1] +
                 (this->A).v[0][2];
  *(double *)(p + 8) = local_28[1] * (this->A).v[1][1] + (this->A).v[1][2];
  return;
}

Assistant:

void PinholeCamera::projectPointLocal(Vector2d &p, const Vector3d &Pc) const
{
  // apply lens distortion

  Vector3d P=Pc/Pc[2];

  if (dist != 0)
  {
    const double x=P[0];
    const double y=P[1];
    dist->transform(P[0], P[1], x, y);
  }

  // apply camera matrix

  p[0]=A(0, 0)*P[0]+A(0, 1)*P[1]+A(0, 2);
  p[1]=A(1, 1)*P[1]+A(1, 2);
}